

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_next_header_empty.c
# Opt level: O0

void test_archive_read_next_header_empty(void)

{
  FILE *pFVar1;
  wchar_t unaff_retaddr;
  char *in_stack_00000008;
  FILE *f;
  void *in_stack_00000020;
  char *in_stack_fffffffffffffff0;
  
  pFVar1 = fopen("emptyfile","wb");
  fclose(pFVar1);
  pFVar1 = fopen("empty.tar","wb");
  fwrite(nulls,1,0x200,pFVar1);
  assertion_equal_int(in_stack_00000008,unaff_retaddr,(longlong)pFVar1,in_stack_fffffffffffffff0,0,
                      (char *)0x13433a,in_stack_00000020);
  fclose(pFVar1);
  test_empty_file1();
  test_empty_file2();
  test_empty_tarfile();
  return;
}

Assistant:

DEFINE_TEST(test_archive_read_next_header_empty)
{
	FILE *f;

	/* Create an empty file. */
	f = fopen("emptyfile", "wb");
	fclose(f);

	/* Create a file with 512 zero bytes. */
	f = fopen("empty.tar", "wb");
	assertEqualInt(512, fwrite(nulls, 1, 512, f));
	fclose(f);

	test_empty_file1();
	test_empty_file2();
	test_empty_tarfile();

}